

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O2

RC __thiscall SM_Manager::CalcStats(SM_Manager *this,char *relName)

{
  float *pfVar1;
  int iVar2;
  RC RVar3;
  ostream *poVar4;
  size_t sVar5;
  Attr *attributes;
  ulong uVar6;
  int i;
  int iVar7;
  long lVar8;
  long lVar9;
  RelCatEntry *rEntry;
  ulong uVar10;
  long lVar11;
  Attr *pAVar12;
  SM_Manager *pSVar13;
  RM_FileHandle *fh_00;
  float fVar14;
  RelCatEntry *relEntry;
  SM_Manager *local_1b8;
  RM_Record attrRec;
  AttrCatEntry *aEntry;
  RM_Record rec;
  vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  numDistinct;
  SM_AttrIterator attrIt;
  RM_Record relRec;
  RM_FileHandle fh;
  RM_FileScan fs;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Calculating stats for relation ");
  poVar4 = std::operator<<(poVar4,relName);
  std::endl<char,std::char_traits<char>>(poVar4);
  sVar5 = strlen(relName);
  RVar3 = 0x12e;
  if (sVar5 < 0x19) {
    RM_Record::RM_Record(&relRec);
    RVar3 = GetRelEntry(this,relName,&relRec,&relEntry);
    rEntry = relEntry;
    if (RVar3 == 0) {
      uVar10 = (ulong)relEntry->attrCount;
      local_1b8 = this;
      attributes = (Attr *)malloc(uVar10 * 0x30);
      pAVar12 = attributes;
      for (lVar8 = 0; pSVar13 = local_1b8, lVar8 < (int)uVar10; lVar8 = lVar8 + 1) {
        pAVar12->numDistinct = 0;
        pAVar12->maxValue = 0.0;
        *(undefined8 *)&pAVar12->minValue = 0;
        *(undefined8 *)&pAVar12->ih = 0;
        pAVar12->recInsert = (_func_bool_char_ptr_string_int *)0x0;
        pAVar12->offset = 0;
        pAVar12->type = 0;
        pAVar12->length = 0;
        pAVar12->indexNo = 0;
        IX_Manager::DestroyIndex((IX_Manager *)&fs);
        attrIt.validIterator = false;
        attrIt._1_7_ = 0;
        attrIt.fs.openScan = false;
        attrIt.fs._1_7_ = 0;
        attrIt.fs.comparator._0_4_ = 0x10671e;
        attrIt.fs.comparator._4_4_ = 0;
        attrIt.fs.attrOffset = 0;
        attrIt.fs._28_8_ = 0x7f7fffff00800000;
        pAVar12->offset = 0;
        pAVar12->type = 0;
        pAVar12->length = 0;
        pAVar12->indexNo = 0;
        *(undefined8 *)((long)&pAVar12->recInsert + 4) = 0;
        pAVar12->maxValue = 1.1754944e-38;
        pAVar12->minValue = 3.4028235e+38;
        *(RM_FileHandle **)&pAVar12->ih = attrIt.fs.fileHandle;
        pAVar12->recInsert = recInsert_string;
        IX_IndexHandle::~IX_IndexHandle((IX_IndexHandle *)&attrIt.fs.fileHandle);
        IX_IndexHandle::~IX_IndexHandle((IX_IndexHandle *)&fs);
        uVar10 = (ulong)(uint)relEntry->attrCount;
        pAVar12 = pAVar12 + 1;
        rEntry = relEntry;
      }
      RVar3 = PrepareAttr(local_1b8,rEntry,attributes);
      if (RVar3 == 0) {
        std::
        vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::vector(&numDistinct,(long)relEntry->attrCount,(allocator_type *)&attrIt);
        uVar6 = 0;
        uVar10 = (ulong)(uint)relEntry->attrCount;
        if (relEntry->attrCount < 1) {
          uVar10 = uVar6;
        }
        for (; uVar10 * 0x30 - uVar6 != 0; uVar6 = uVar6 + 0x30) {
          *(undefined4 *)((long)&attributes->numDistinct + uVar6) = 0;
          *(undefined8 *)((long)&attributes->maxValue + uVar6) = 0x7f7fffff00800000;
        }
        relEntry->numTuples = 0;
        relEntry->statsInitialized = true;
        RM_FileScan::RM_FileScan(&fs);
        RM_FileHandle::RM_FileHandle(&fh);
        RM_Record::RM_Record(&rec);
        RVar3 = RM_Manager::OpenFile(pSVar13->rmm,relName,&fh);
        if ((RVar3 == 0) &&
           (RVar3 = RM_FileScan::OpenScan(&fs,&fh,INT,0,0,NO_OP,(void *)0x0,NO_HINT), RVar3 == 0)) {
          while( true ) {
            RVar3 = RM_FileScan::GetNextRec(&fs,&rec);
            if (RVar3 == 0x6e) break;
            RVar3 = RM_Record::GetData(&rec,(char **)&attrRec);
            if (RVar3 != 0) goto LAB_0010920e;
            lVar8 = 0;
            for (lVar11 = 0; lVar11 < relEntry->attrCount; lVar11 = lVar11 + 1) {
              lVar9 = (long)*(int *)((long)&attributes->offset + lVar8);
              attrIt._0_8_ = &attrIt.fs.fileHandle;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&attrIt,(long)attrRec.rid + lVar9,
                         (long)*(int *)((long)&attributes->length + lVar8) +
                         (long)attrRec.rid + lVar9);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)(&((numDistinct.
                                super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.field_0x0
                            + lVar8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &attrIt);
              iVar7 = *(int *)((long)&attributes->type + lVar8);
              if (iVar7 == 0) {
                fVar14 = (float)*(int *)((long)attrRec.rid + lVar9);
              }
              else if (iVar7 == 2) {
                fVar14 = (float)(int)*(char *)((long)attrRec.rid + lVar9);
              }
              else {
                fVar14 = *(float *)((long)attrRec.rid + lVar9);
              }
              pfVar1 = (float *)((long)&attributes->maxValue + lVar8);
              if (*pfVar1 <= fVar14 && fVar14 != *pfVar1) {
                *(float *)((long)&attributes->maxValue + lVar8) = fVar14;
              }
              if (fVar14 < *(float *)((long)&attributes->minValue + lVar8)) {
                *(float *)((long)&attributes->minValue + lVar8) = fVar14;
              }
              std::__cxx11::string::~string((string *)&attrIt);
              lVar8 = lVar8 + 0x30;
            }
            relEntry->numTuples = relEntry->numTuples + 1;
            pSVar13 = local_1b8;
          }
          RVar3 = RM_FileHandle::UpdateRec(&pSVar13->relcatFH,&relRec);
          if (RVar3 == 0) {
            iVar7 = -1;
            RVar3 = RM_FileHandle::ForcePages(&pSVar13->relcatFH,-1);
            if (RVar3 == 0) {
              SM_AttrIterator::SM_AttrIterator(&attrIt);
              fh_00 = &pSVar13->attrcatFH;
              RVar3 = SM_AttrIterator::OpenIterator(&attrIt,fh_00,relEntry->relName);
              if (RVar3 == 0) {
                RM_Record::RM_Record(&attrRec);
                do {
                  iVar7 = iVar7 + 1;
                  if (relEntry->attrCount <= iVar7) {
                    RVar3 = SM_AttrIterator::CloseIterator(&attrIt);
                    if (RVar3 == 0) {
                      RVar3 = RM_FileHandle::ForcePages(fh_00,-1);
                    }
                    break;
                  }
                  RVar3 = SM_AttrIterator::GetNextAttr(&attrIt,&attrRec,&aEntry);
                  if (RVar3 != 0) break;
                  iVar2 = aEntry->attrNum;
                  fVar14 = attributes[iVar2].minValue;
                  aEntry->maxValue = attributes[iVar2].maxValue;
                  aEntry->minValue = fVar14;
                  aEntry->numDistinct =
                       (int)numDistinct.
                            super__Vector_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[iVar2]._M_t._M_impl.
                            super__Rb_tree_header._M_node_count;
                  RVar3 = RM_FileHandle::UpdateRec(fh_00,&attrRec);
                } while (RVar3 == 0);
                RM_Record::~RM_Record(&attrRec);
              }
              SM_AttrIterator::~SM_AttrIterator(&attrIt);
            }
          }
        }
LAB_0010920e:
        RM_Record::~RM_Record(&rec);
        RM_FileHandle::~RM_FileHandle(&fh);
        RM_FileScan::~RM_FileScan(&fs);
        std::
        vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&numDistinct);
      }
    }
    RM_Record::~RM_Record(&relRec);
  }
  return RVar3;
}

Assistant:

RC SM_Manager::CalcStats(const char *relName){
  RC rc = 0;
  cout << "Calculating stats for relation " << relName << endl;
  if(strlen(relName) > MAXNAME) // check for whether this is a valid name
    return (SM_BADRELNAME);

  // Retrieve the record associated with the relation
  RM_Record relRec;
  RelCatEntry *relEntry;
  if((rc = GetRelEntry(relName, relRec, relEntry)))
    return (rc);

  // Creates a struct containing info about the attributes to 
  // help with loading
  Attr* attributes = (Attr *)malloc(sizeof(Attr)*relEntry->attrCount);
  for(int i=0; i < relEntry->attrCount; i++){
    memset((void*)&attributes[i], 0, sizeof(attributes[i]));
    IX_IndexHandle ih;
    attributes[i] = (Attr) {0, 0, 0, 0, ih, recInsert_string, 0, FLT_MIN, FLT_MAX};
  }
  if((rc = PrepareAttr(relEntry, attributes)))
    return (rc);

  vector<set<string> > numDistinct(relEntry->attrCount);
  for(int i=0; i < relEntry->attrCount; i++){
    attributes[i].numDistinct = 0;
    attributes[i].maxValue = FLT_MIN;
    attributes[i].minValue = FLT_MAX;
  }
  relEntry->numTuples = 0;
  relEntry->statsInitialized = true;

  // Open the relation and iterate through it
  RM_FileScan fs;
  RM_FileHandle fh;
  RM_Record rec;
  if((rc = rmm.OpenFile(relName, fh)) || (rc = fs.OpenScan(fh, INT, 0, 0, NO_OP, NULL)))
    return (rc);
  while(RM_EOF != fs.GetNextRec(rec)){
    char * recData;
    if((rc = rec.GetData(recData)))
      return (rc);

    for(int i = 0;  i < relEntry->attrCount; i++){
      int offset = attributes[i].offset;
      string attr(recData + offset, recData + offset + attributes[i].length);
      numDistinct[i].insert(attr);
      float attrValue = 0.0;
      if(attributes[i].type == STRING)
        attrValue = ConvertStrToFloat(recData + offset);
      else if(attributes[i].type == INT)
        attrValue = (float) *((int*) (recData + offset));
      else
        attrValue = *((float*)(recData + offset));
      if(attrValue > attributes[i].maxValue)
        attributes[i].maxValue = attrValue;
      if(attrValue < attributes[i].minValue)
        attributes[i].minValue = attrValue;
    }
    relEntry->numTuples++;

  }

  // write everything back
  if((rc = relcatFH.UpdateRec(relRec)) || (rc = relcatFH.ForcePages()))
    return (rc);

  SM_AttrIterator attrIt;
  if((rc = attrIt.OpenIterator(attrcatFH, relEntry->relName)))
    return (rc);
  RM_Record attrRec;
  AttrCatEntry *aEntry;
  for(int i = 0; i < relEntry->attrCount; i++){
    if((rc = attrIt.GetNextAttr(attrRec, aEntry)))
      return (rc);
    // For each attribute, place its information in the appropriate slot
    int slot = aEntry->attrNum;
    aEntry->minValue = attributes[slot].minValue;
    aEntry->maxValue = attributes[slot].maxValue;
    aEntry->numDistinct = numDistinct[slot].size();
    if((rc = attrcatFH.UpdateRec(attrRec)))
      return (rc);
  }
  if((rc = attrIt.CloseIterator()))
    return (rc);
  if((rc = attrcatFH.ForcePages()))
    return (rc);


  return (0);
}